

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5MultiIterDoCompare(Fts5Iter *pIter,int iOut)

{
  undefined2 uVar1;
  undefined2 uVar2;
  Fts5Buffer *pRight;
  long lVar3;
  Fts5Buffer *pLeft;
  int in_ESI;
  long in_RDI;
  int res;
  Fts5CResult *pRes;
  Fts5SegIter *p2;
  Fts5SegIter *p1;
  int iRes;
  int i2;
  int i1;
  int local_3c;
  undefined2 local_20;
  uint local_1c;
  uint local_18;
  
  pRight = (Fts5Buffer *)(*(long *)(in_RDI + 0x60) + (long)in_ESI * 4);
  if (in_ESI < *(int *)(in_RDI + 0x48) / 2) {
    local_18 = (uint)*(ushort *)(*(long *)(in_RDI + 0x60) + (long)(in_ESI << 1) * 4);
    local_1c = (uint)*(ushort *)(*(long *)(in_RDI + 0x60) + (long)(in_ESI * 2 + 1) * 4);
  }
  else {
    local_18 = (in_ESI - *(int *)(in_RDI + 0x48) / 2) * 2;
    local_1c = local_18 + 1;
  }
  lVar3 = in_RDI + 0x68 + (long)(int)local_18 * 0x80;
  pLeft = (Fts5Buffer *)(in_RDI + 0x68 + (long)(int)local_1c * 0x80);
  *(undefined1 *)((long)&pRight->p + 2) = 0;
  local_20 = (undefined2)local_1c;
  uVar1 = local_20;
  uVar2 = uVar1;
  if ((*(long *)(lVar3 + 0x10) != 0) &&
     (local_20 = (undefined2)local_18, uVar2 = local_20, pLeft[1].p != (u8 *)0x0)) {
    local_3c = fts5BufferCompare(pLeft,pRight);
    if (local_3c == 0) {
      *(undefined1 *)((long)&pRight->p + 2) = 1;
      if (*(u8 **)(lVar3 + 0x70) == pLeft[7].p) {
        return local_1c;
      }
      local_3c = 1;
      if ((uint)((long)pLeft[7].p < *(long *)(lVar3 + 0x70)) == *(uint *)(in_RDI + 0x4c)) {
        local_3c = -1;
      }
    }
    uVar2 = uVar1;
    if (local_3c < 0) {
      uVar2 = local_20;
    }
  }
  local_20 = uVar2;
  *(undefined2 *)&pRight->p = local_20;
  return 0;
}

Assistant:

static int fts5MultiIterDoCompare(Fts5Iter *pIter, int iOut){
  int i1;                         /* Index of left-hand Fts5SegIter */
  int i2;                         /* Index of right-hand Fts5SegIter */
  int iRes;
  Fts5SegIter *p1;                /* Left-hand Fts5SegIter */
  Fts5SegIter *p2;                /* Right-hand Fts5SegIter */
  Fts5CResult *pRes = &pIter->aFirst[iOut];

  assert( iOut<pIter->nSeg && iOut>0 );
  assert( pIter->bRev==0 || pIter->bRev==1 );

  if( iOut>=(pIter->nSeg/2) ){
    i1 = (iOut - pIter->nSeg/2) * 2;
    i2 = i1 + 1;
  }else{
    i1 = pIter->aFirst[iOut*2].iFirst;
    i2 = pIter->aFirst[iOut*2+1].iFirst;
  }
  p1 = &pIter->aSeg[i1];
  p2 = &pIter->aSeg[i2];

  pRes->bTermEq = 0;
  if( p1->pLeaf==0 ){           /* If p1 is at EOF */
    iRes = i2;
  }else if( p2->pLeaf==0 ){     /* If p2 is at EOF */
    iRes = i1;
  }else{
    int res = fts5BufferCompare(&p1->term, &p2->term);
    if( res==0 ){
      assert_nc( i2>i1 );
      assert_nc( i2!=0 );
      pRes->bTermEq = 1;
      if( p1->iRowid==p2->iRowid ){
        return i2;
      }
      res = ((p1->iRowid > p2->iRowid)==pIter->bRev) ? -1 : +1;
    }
    assert( res!=0 );
    if( res<0 ){
      iRes = i1;
    }else{
      iRes = i2;
    }
  }

  pRes->iFirst = (u16)iRes;
  return 0;
}